

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall cfd::core::Pubkey::CreateNegate(Pubkey *__return_storage_ptr__,Pubkey *this)

{
  ByteData *in_stack_ffffffffffffff88;
  Pubkey *this_00;
  ByteData local_48;
  undefined1 local_30 [8];
  ByteData negated;
  Pubkey *this_local;
  
  this_00 = __return_storage_ptr__;
  negated.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  WallyUtil::NegatePubkey((ByteData *)local_30,&this->data_);
  ByteData::ByteData(&this_00->data_,in_stack_ffffffffffffff88);
  Pubkey(this_00,&local_48);
  ByteData::~ByteData((ByteData *)0x44f613);
  ByteData::~ByteData((ByteData *)0x44f61c);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::CreateNegate() const {
  ByteData negated = WallyUtil::NegatePubkey(data_);
  return Pubkey(negated);
}